

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

void __thiscall ConvexDecomposition::Quaternion::Normalize(Quaternion *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  fVar4 = (this->super_float4).x;
  fVar5 = (this->super_float4).y;
  fVar6 = (this->super_float4).z;
  fVar3 = (this->super_float4).w;
  auVar8._0_4_ = fVar4 * fVar4;
  auVar8._4_4_ = fVar5 * fVar5;
  auVar8._8_4_ = fVar6 * fVar6;
  auVar8._12_4_ = fVar3 * fVar3;
  auVar2 = vshufps_avx(auVar8,auVar8,0xff);
  auVar9 = vmovshdup_avx(auVar8);
  auVar1 = vshufpd_avx(auVar8,auVar8,1);
  auVar9 = ZEXT416((uint)(auVar2._0_4_ + auVar8._0_4_ + auVar9._0_4_ + auVar1._0_4_));
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  if (auVar9._0_4_ < 1e-09) {
    fVar4 = 0.0;
    fVar5 = 0.0;
    fVar6 = 0.0;
    fVar7 = 1.0;
  }
  else {
    fVar7 = 1.0 / auVar9._0_4_;
    fVar4 = fVar7 * fVar4;
    fVar5 = fVar7 * fVar5;
    fVar6 = fVar7 * fVar6;
    fVar7 = fVar7 * fVar3;
  }
  (this->super_float4).x = fVar4;
  (this->super_float4).y = fVar5;
  (this->super_float4).z = fVar6;
  (this->super_float4).w = fVar7;
  return;
}

Assistant:

void Quaternion::Normalize()
{
	float m = sqrtf(sqr(w)+sqr(x)+sqr(y)+sqr(z));
	if(m<0.000000001f) {
		w=1.0f;
		x=y=z=0.0f;
		return;
	}
	(*this) *= (1.0f/m);
}